

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void __thiscall crnlib::symbol_codec::arith_renorm_enc_interval(symbol_codec *this)

{
  uint *puVar1;
  uchar uVar2;
  uint uVar3;
  
  do {
    uVar2 = *(uchar *)((long)&this->m_arith_base + 3);
    uVar3 = (this->m_arith_output_buf).m_size;
    if ((this->m_arith_output_buf).m_capacity <= uVar3) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_arith_output_buf,uVar3 + 1,true,1,(object_mover)0x0,
                 false);
    }
    (this->m_arith_output_buf).m_p[(this->m_arith_output_buf).m_size] = uVar2;
    puVar1 = &(this->m_arith_output_buf).m_size;
    *puVar1 = *puVar1 + 1;
    this->m_total_bits_written = this->m_total_bits_written + 8;
    this->m_arith_base = this->m_arith_base << 8;
    uVar3 = this->m_arith_length << 8;
    this->m_arith_length = uVar3;
  } while (uVar3 < 0x1000000);
  return;
}

Assistant:

void symbol_codec::arith_renorm_enc_interval()
    {
        do
        {
            m_arith_output_buf.push_back((m_arith_base >> 24) & 0xFF);
            m_total_bits_written += 8;

            m_arith_base <<= 8;
        } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
    }